

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_binary.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  uint *puVar1;
  size_t *psVar2;
  float fVar3;
  ushort uVar4;
  ushort uVar5;
  long lVar6;
  Offset<MyGame::Sample::Weapon> off;
  uint start;
  uint uVar7;
  uint uVar8;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int>_> off_00;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> off_01;
  uoffset_t root;
  int iVar9;
  uint *puVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  unsigned_short vtsize;
  short sVar14;
  char *__function;
  ulong uVar15;
  int *piVar16;
  short *psVar17;
  uint8_t *offset_location;
  Offset<MyGame::Sample::Weapon> *v;
  ulong uVar18;
  ulong uVar19;
  long *plVar20;
  Offset<MyGame::Sample::Weapon> axe;
  Offset<MyGame::Sample::Weapon> sword;
  vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
  weapons_vector;
  FlatBufferBuilder builder;
  string expected_weapon_names [2];
  uchar inv_data [10];
  Offset<MyGame::Sample::Weapon> local_170;
  Offset<MyGame::Sample::Weapon> local_16c;
  Offset<MyGame::Sample::Weapon> *local_168;
  iterator iStack_160;
  Offset<MyGame::Sample::Weapon> *local_158;
  long *local_148;
  size_t local_140;
  long local_138 [2];
  int *local_128;
  uint *local_120;
  Vec3 local_118;
  FlatBufferBuilderImpl<false> local_108;
  size_t *local_88;
  size_t asStack_80 [3];
  long *local_68 [2];
  long local_58 [3];
  uchar local_40 [16];
  
  local_108.buf_.allocator_ = (Allocator *)0x0;
  local_108.buf_.own_allocator_ = false;
  local_108.buf_.initial_size_ = 0x400;
  local_108.buf_.max_size_ = 0x7fffffff;
  local_108.buf_.buffer_minalign_ = 8;
  local_108.buf_.reserved_ = 0;
  local_108.buf_.size_ = 0;
  local_108.length_of_64_bit_region_ = 0;
  local_108.nested = false;
  local_108.finished = false;
  local_108.buf_.buf_ = (uint8_t *)0x0;
  local_108.buf_.cur_._0_6_ = 0;
  local_108.buf_.cur_._6_2_ = 0;
  local_108.buf_.scratch_._0_6_ = 0;
  local_108._78_8_ = 0;
  local_108.minalign_ = 1;
  local_108.force_defaults_ = false;
  local_108.dedup_vtables_ = true;
  local_108.string_pool = (StringOffsetMap *)0x0;
  flatbuffers::FlatBufferBuilderImpl<false>::CreateStringImpl(&local_108,"Sword",5);
  uVar7 = local_108.buf_.size_;
  flatbuffers::FlatBufferBuilderImpl<false>::CreateStringImpl(&local_108,"Axe",3);
  uVar8 = local_108.buf_.size_;
  flatbuffers::FlatBufferBuilderImpl<false>::NotNested(&local_108);
  start = local_108.buf_.size_;
  local_108.nested = true;
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>
            (&local_108,4,(Offset<flatbuffers::String>)uVar7);
  uVar7 = flatbuffers::FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>(&local_108,3);
  flatbuffers::FlatBufferBuilderImpl<false>::TrackField(&local_108,6,uVar7);
  local_16c.o = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(&local_108,start);
  flatbuffers::FlatBufferBuilderImpl<false>::NotNested(&local_108);
  uVar7 = local_108.buf_.size_;
  local_108.nested = true;
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>
            (&local_108,4,(Offset<flatbuffers::String>)uVar8);
  uVar8 = flatbuffers::FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>(&local_108,5);
  flatbuffers::FlatBufferBuilderImpl<false>::TrackField(&local_108,6,uVar8);
  local_170.o = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(&local_108,uVar7);
  local_168 = (Offset<MyGame::Sample::Weapon> *)0x0;
  iStack_160._M_current = (Offset<MyGame::Sample::Weapon> *)0x0;
  local_158 = (Offset<MyGame::Sample::Weapon> *)0x0;
  std::
  vector<flatbuffers::Offset<MyGame::Sample::Weapon>,std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>>>
  ::_M_realloc_insert<flatbuffers::Offset<MyGame::Sample::Weapon>const&>
            ((vector<flatbuffers::Offset<MyGame::Sample::Weapon>,std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>>>
              *)&local_168,(iterator)0x0,&local_16c);
  if (iStack_160._M_current == local_158) {
    std::
    vector<flatbuffers::Offset<MyGame::Sample::Weapon>,std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>>>
    ::_M_realloc_insert<flatbuffers::Offset<MyGame::Sample::Weapon>const&>
              ((vector<flatbuffers::Offset<MyGame::Sample::Weapon>,std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>>>
                *)&local_168,iStack_160,&local_170);
  }
  else {
    (iStack_160._M_current)->o = local_170.o;
    iStack_160._M_current = iStack_160._M_current + 1;
  }
  v = (Offset<MyGame::Sample::Weapon> *)
      &flatbuffers::
       data<flatbuffers::Offset<MyGame::Sample::Weapon>,std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>>>(std::vector<flatbuffers::Offset<MyGame::Sample::Weapon>,std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>>>const&)
       ::t;
  if ((long)iStack_160._M_current - (long)local_168 != 0) {
    v = local_168;
  }
  off_00 = flatbuffers::FlatBufferBuilderImpl<false>::CreateVector<MyGame::Sample::Weapon>
                     (&local_108,v,(long)iStack_160._M_current - (long)local_168 >> 2);
  local_118.x_ = 1.0;
  local_118.y_ = 2.0;
  local_118.z_ = 3.0;
  flatbuffers::FlatBufferBuilderImpl<false>::CreateStringImpl(&local_108,"MyMonster",9);
  uVar7 = local_108.buf_.size_;
  local_40[0] = '\0';
  local_40[1] = '\x01';
  local_40[2] = '\x02';
  local_40[3] = '\x03';
  local_40[4] = '\x04';
  local_40[5] = '\x05';
  local_40[6] = '\x06';
  local_40[7] = '\a';
  local_40[8] = '\b';
  local_40[9] = '\t';
  off_01 = flatbuffers::FlatBufferBuilderImpl<false>::
           CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>
                     (&local_108,local_40,10);
  off.o = local_170.o;
  flatbuffers::FlatBufferBuilderImpl<false>::NotNested(&local_108);
  uVar8 = local_108.buf_.size_;
  local_108.nested = true;
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<MyGame::Sample::Vec3_const*,unsigned_int>>
            (&local_108,0x18,
             (Offset<flatbuffers::Vector<const_MyGame::Sample::Vec3_*,_unsigned_int>_>)0x0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<void>(&local_108,0x16,(Offset<void>)off.o);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,unsigned_int>>
            (&local_108,0x12,off_00);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>(&local_108,0xe,off_01);
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>
            (&local_108,10,(Offset<flatbuffers::String>)uVar7);
  flatbuffers::FlatBufferBuilderImpl<false>::AddStruct<MyGame::Sample::Vec3>
            (&local_108,4,&local_118);
  uVar7 = flatbuffers::FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
                    (&local_108,0x50);
  flatbuffers::FlatBufferBuilderImpl<false>::TrackField(&local_108,8,uVar7);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<short>(&local_108,6,0x96,0x96);
  uVar7 = flatbuffers::FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                    (&local_108,'\x01');
  flatbuffers::FlatBufferBuilderImpl<false>::TrackField(&local_108,0x14,uVar7);
  uVar7 = flatbuffers::FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
                    (&local_108,'\0');
  flatbuffers::FlatBufferBuilderImpl<false>::TrackField(&local_108,0x10,uVar7);
  root = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(&local_108,uVar8);
  flatbuffers::FlatBufferBuilderImpl<false>::Finish(&local_108,root,(char *)0x0,false);
  puVar10 = (uint *)flatbuffers::FlatBufferBuilderImpl<false>::GetBufferPointer(&local_108);
  if (puVar10 == (uint *)0x0) {
    piVar16 = (int *)0x0;
  }
  else {
    piVar16 = (int *)((ulong)*puVar10 + (long)puVar10);
  }
  if (8 < *(ushort *)((long)piVar16 - (long)*piVar16)) {
    lVar11 = -(long)*piVar16;
    uVar18 = (ulong)*(ushort *)((long)piVar16 + lVar11 + 8);
    if ((uVar18 != 0) && (*(short *)((long)piVar16 + uVar18) == 0x50)) {
      uVar18 = (ulong)*(ushort *)((long)piVar16 + lVar11 + 6);
      if ((uVar18 != 0) && (*(short *)((long)piVar16 + uVar18) != 0x96)) {
        __assert_fail("monster->mana() == 150",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/samples/sample_binary.cpp"
                      ,0x46,"int main(int, const char **)");
      }
      uVar18 = (ulong)*(ushort *)((long)piVar16 + lVar11 + 10);
      puVar10 = (uint *)((long)piVar16 + *(uint *)((long)piVar16 + uVar18) + uVar18);
      psVar2 = asStack_80 + 1;
      local_88 = psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,puVar10 + 1,
                 (long)piVar16 + (ulong)*puVar10 + *(uint *)((long)piVar16 + uVar18) + uVar18 + 4);
      iVar9 = std::__cxx11::string::compare((char *)&local_88);
      if (iVar9 != 0) {
        __assert_fail("monster->name()->str() == \"MyMonster\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/samples/sample_binary.cpp"
                      ,0x47,"int main(int, const char **)");
      }
      if (local_88 != psVar2) {
        operator_delete(local_88,asStack_80[1] + 1);
      }
      uVar4 = *(ushort *)((long)piVar16 - (long)*piVar16);
      if (4 < uVar4) {
        lVar11 = -(long)*piVar16;
        uVar5 = *(ushort *)((long)piVar16 + lVar11 + 4);
        if (uVar5 != 0) {
          fVar3 = *(float *)((long)piVar16 + (ulong)uVar5 + 8);
          if ((fVar3 != 3.0) || (NAN(fVar3))) {
            __assert_fail("pos->z() == 3.0f",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/samples/sample_binary.cpp"
                          ,0x4c,"int main(int, const char **)");
          }
          if ((uVar4 < 0xf) ||
             (uVar18 = (ulong)*(ushort *)((long)piVar16 + lVar11 + 0xe), uVar18 == 0)) {
            __assert_fail("inv",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/samples/sample_binary.cpp"
                          ,0x51,"int main(int, const char **)");
          }
          if (*(uint *)((long)piVar16 + *(uint *)((long)piVar16 + uVar18) + uVar18) < 10) {
            __function = 
            "return_type flatbuffers::Vector<unsigned char>::Get(SizeT) const [T = unsigned char, SizeT = unsigned int]"
            ;
LAB_001019ee:
            __assert_fail("i < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                          ,0xc1,__function);
          }
          if (*(char *)((long)piVar16 + (ulong)*(uint *)((long)piVar16 + uVar18) + uVar18 + 0xd) !=
              '\t') {
            __assert_fail("inv->Get(9) == 9",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/samples/sample_binary.cpp"
                          ,0x52,"int main(int, const char **)");
          }
          local_88 = psVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Sword","");
          local_68[0] = local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Axe","");
          lVar11 = (long)*piVar16;
          uVar18 = (ulong)*(ushort *)((long)piVar16 + (0x12 - lVar11));
          uVar7 = *(uint *)((long)piVar16 + *(uint *)((long)piVar16 + uVar18) + uVar18);
          uVar12 = (ulong)uVar7;
          if (uVar7 != 0) {
            puVar10 = (uint *)((long)piVar16 + *(uint *)((long)piVar16 + uVar18) + uVar18);
            local_120 = puVar10 + 1;
            psVar17 = &DAT_00103024;
            uVar18 = 0;
            uVar19 = 0;
            local_128 = piVar16;
            do {
              if (uVar12 <= uVar19) {
LAB_001019d9:
                __function = 
                "return_type flatbuffers::Vector<flatbuffers::Offset<MyGame::Sample::Weapon>>::Get(SizeT) const [T = flatbuffers::Offset<MyGame::Sample::Weapon>, SizeT = unsigned int]"
                ;
                goto LAB_001019ee;
              }
              puVar1 = (uint *)((long)local_120 + (uVar18 & 0xffffffff));
              uVar12 = (ulong)*(uint *)((long)local_120 + (uVar18 & 0xffffffff));
              uVar13 = (ulong)*(ushort *)
                               ((long)puVar1 + (uVar12 - (long)*(int *)(uVar12 + (long)puVar1)) + 4)
              ;
              lVar6 = uVar13 + uVar12;
              uVar12 = (ulong)*(uint *)((long)puVar1 + uVar13 + uVar12);
              lVar11 = (long)puVar1 + uVar12 + 4 + lVar6;
              local_148 = local_138;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_148,lVar11,
                         (long)puVar1 + (ulong)*(uint *)(lVar11 + -4) + uVar12 + lVar6 + 4);
              plVar20 = local_148;
              if ((local_140 != asStack_80[uVar18]) ||
                 ((local_140 != 0 &&
                  (iVar9 = bcmp(local_148,(&local_88)[uVar18],local_140), iVar9 != 0)))) {
                __assert_fail("weps->Get(i)->name()->str() == expected_weapon_names[i]",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/samples/sample_binary.cpp"
                              ,0x5a,"int main(int, const char **)");
              }
              if (plVar20 != local_138) {
                operator_delete(plVar20,local_138[0] + 1);
              }
              uVar12 = (ulong)*puVar10;
              if (uVar12 <= uVar19) goto LAB_001019d9;
              uVar13 = (ulong)*puVar1;
              if ((*(ushort *)((long)puVar1 + (uVar13 - (long)*(int *)((long)puVar1 + uVar13))) < 7)
                 || (uVar15 = (ulong)*(ushort *)
                                      ((long)puVar1 +
                                      ((uVar13 + 6) - (long)*(int *)((long)puVar1 + uVar13))),
                    uVar15 == 0)) {
                sVar14 = 0;
              }
              else {
                sVar14 = *(short *)((long)puVar1 + uVar15 + uVar13);
              }
              if (sVar14 != *psVar17) {
                __assert_fail("weps->Get(i)->damage() == expected_weapon_damages[i]",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/samples/sample_binary.cpp"
                              ,0x5b,"int main(int, const char **)");
              }
              uVar19 = uVar19 + 1;
              uVar18 = uVar18 + 4;
              psVar17 = psVar17 + 1;
            } while (uVar19 < uVar12);
            lVar11 = (long)*local_128;
            piVar16 = local_128;
          }
          plVar20 = local_58;
          lVar11 = -lVar11;
          if (((*(ushort *)((long)piVar16 + lVar11) < 0x15) ||
              (uVar18 = (ulong)*(ushort *)((long)piVar16 + lVar11 + 0x14), uVar18 == 0)) ||
             (*(char *)((long)piVar16 + uVar18) != '\x01')) {
            __assert_fail("monster->equipped_type() == Equipment_Weapon",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/samples/sample_binary.cpp"
                          ,0x61,"int main(int, const char **)");
          }
          if ((*(ushort *)((long)piVar16 + lVar11) < 0x17) ||
             (uVar18 = (ulong)*(ushort *)((long)piVar16 + lVar11 + 0x16), uVar18 == 0)) {
            piVar16 = (int *)0x0;
          }
          else {
            piVar16 = (int *)((long)piVar16 + *(uint *)((long)piVar16 + uVar18) + uVar18);
          }
          uVar18 = (ulong)*(ushort *)((long)piVar16 + (4 - (long)*piVar16));
          lVar11 = (long)piVar16 + (ulong)*(uint *)((long)piVar16 + uVar18) + 4 + uVar18;
          local_148 = local_138;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_148,lVar11,
                     (long)piVar16 +
                     (ulong)*(uint *)(lVar11 + -4) + *(uint *)((long)piVar16 + uVar18) + uVar18 + 4)
          ;
          iVar9 = std::__cxx11::string::compare((char *)&local_148);
          if (iVar9 != 0) {
            __assert_fail("equipped->name()->str() == \"Axe\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/samples/sample_binary.cpp"
                          ,99,"int main(int, const char **)");
          }
          if (local_148 != local_138) {
            operator_delete(local_148,local_138[0] + 1);
          }
          if (((6 < *(ushort *)((long)piVar16 - (long)*piVar16)) &&
              (uVar18 = (ulong)*(ushort *)((long)piVar16 + (6 - (long)*piVar16)), uVar18 != 0)) &&
             (*(short *)((long)piVar16 + uVar18) == 5)) {
            puts("The FlatBuffer was successfully created and verified!");
            lVar11 = -0x40;
            do {
              if (plVar20 != (long *)plVar20[-2]) {
                operator_delete((long *)plVar20[-2],*plVar20 + 1);
              }
              plVar20 = plVar20 + -4;
              lVar11 = lVar11 + 0x20;
            } while (lVar11 != 0);
            if (local_168 != (Offset<MyGame::Sample::Weapon> *)0x0) {
              operator_delete(local_168,(long)local_158 - (long)local_168);
            }
            flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_108);
            return 0;
          }
          __assert_fail("equipped->damage() == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/samples/sample_binary.cpp"
                        ,100,"int main(int, const char **)");
        }
      }
      __assert_fail("pos",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/samples/sample_binary.cpp"
                    ,0x4b,"int main(int, const char **)");
    }
  }
  __assert_fail("monster->hp() == 80",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/samples/sample_binary.cpp"
                ,0x45,"int main(int, const char **)");
}

Assistant:

int main(int /*argc*/, const char * /*argv*/[]) {
  // Build up a serialized buffer algorithmically:
  flatbuffers::FlatBufferBuilder builder;

  // First, lets serialize some weapons for the Monster: A 'sword' and an 'axe'.
  auto weapon_one_name = builder.CreateString("Sword");
  short weapon_one_damage = 3;

  auto weapon_two_name = builder.CreateString("Axe");
  short weapon_two_damage = 5;

  // Use the `CreateWeapon` shortcut to create Weapons with all fields set.
  auto sword = CreateWeapon(builder, weapon_one_name, weapon_one_damage);
  auto axe = CreateWeapon(builder, weapon_two_name, weapon_two_damage);

  // Create a FlatBuffer's `vector` from the `std::vector`.
  std::vector<flatbuffers::Offset<Weapon>> weapons_vector;
  weapons_vector.push_back(sword);
  weapons_vector.push_back(axe);
  auto weapons = builder.CreateVector(weapons_vector);

  // Second, serialize the rest of the objects needed by the Monster.
  auto position = Vec3(1.0f, 2.0f, 3.0f);

  auto name = builder.CreateString("MyMonster");

  unsigned char inv_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9 };
  auto inventory = builder.CreateVector(inv_data, 10);

  // Shortcut for creating monster with all fields set:
  auto orc = CreateMonster(builder, &position, 150, 80, name, inventory,
                           Color_Red, weapons, Equipment_Weapon, axe.Union());

  builder.Finish(orc);  // Serialize the root of the object.

  // We now have a FlatBuffer we can store on disk or send over a network.

  // ** file/network code goes here :) **
  // access builder.GetBufferPointer() for builder.GetSize() bytes

  // Instead, we're going to access it right away (as if we just received it).

  // Get access to the root:
  auto monster = GetMonster(builder.GetBufferPointer());

  // Get and test some scalar types from the FlatBuffer.
  assert(monster->hp() == 80);
  assert(monster->mana() == 150);  // default
  assert(monster->name()->str() == "MyMonster");

  // Get and test a field of the FlatBuffer's `struct`.
  auto pos = monster->pos();
  assert(pos);
  assert(pos->z() == 3.0f);
  (void)pos;

  // Get a test an element from the `inventory` FlatBuffer's `vector`.
  auto inv = monster->inventory();
  assert(inv);
  assert(inv->Get(9) == 9);
  (void)inv;

  // Get and test the `weapons` FlatBuffers's `vector`.
  std::string expected_weapon_names[] = { "Sword", "Axe" };
  short expected_weapon_damages[] = { 3, 5 };
  auto weps = monster->weapons();
  for (unsigned int i = 0; i < weps->size(); i++) {
    assert(weps->Get(i)->name()->str() == expected_weapon_names[i]);
    assert(weps->Get(i)->damage() == expected_weapon_damages[i]);
  }
  (void)expected_weapon_names;
  (void)expected_weapon_damages;

  // Get and test the `Equipment` union (`equipped` field).
  assert(monster->equipped_type() == Equipment_Weapon);
  auto equipped = static_cast<const Weapon *>(monster->equipped());
  assert(equipped->name()->str() == "Axe");
  assert(equipped->damage() == 5);
  (void)equipped;

  printf("The FlatBuffer was successfully created and verified!\n");
}